

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall despot::util::tinyxml::TiXmlComment::Print(TiXmlComment *this,FILE *cfile,int depth)

{
  if (cfile == (FILE *)0x0) {
    __assert_fail("cfile",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x457,
                  "virtual void despot::util::tinyxml::TiXmlComment::Print(FILE *, int) const");
  }
  if (0 < depth) {
    do {
      fwrite("    ",4,1,(FILE *)cfile);
      depth = depth + -1;
    } while (depth != 0);
  }
  fprintf((FILE *)cfile,"<!--%s-->",((this->super_TiXmlNode).value.rep_)->str);
  return;
}

Assistant:

void TiXmlComment::Print(FILE* cfile, int depth) const {
	assert(cfile);
	for (int i = 0; i < depth; i++) {
		fprintf(cfile, "    ");
	}
	fprintf(cfile, "<!--%s-->", value.c_str());
}